

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_import_public_lite.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest_import::PublicImportMessageLite::_InternalSerialize
          (PublicImportMessageLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int32_t value;
  int size;
  uint32_t *puVar2;
  void *data;
  uint32_t cached_has_bits;
  PublicImportMessageLite *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  PublicImportMessageLite *this_local;
  
  puVar2 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar2 & 1) != 0) {
    value = _internal_e(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                             (stream,value,target);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL PublicImportMessageLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const PublicImportMessageLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest_import.PublicImportMessageLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 e = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_e(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest_import.PublicImportMessageLite)
  return target;
}